

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O1

bool test_uintwide_t_edge::test_export_bits(void)

{
  bool bVar1;
  uint chunk_size;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  void *pvVar5;
  byte bVar6;
  int iVar7;
  unsigned_long uVar8;
  ulong uVar9;
  uintwide_t<256U,_unsigned_short,_void,_false> *x;
  uintwide_t<256U,_unsigned_short,_void,_false> *x_00;
  uintwide_t<256U,_unsigned_short,_void,_false> *x_01;
  long lVar10;
  undefined8 *puVar11;
  int iVar12;
  size_type __n;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  local_output_array_type bits_result_from_uintwide_t;
  local_output_array_type bits_result_from_boost;
  local_boost_small_uint_type val_boost;
  uintwide_t<256U,_unsigned_short,_void,_false> val_uintwide_t;
  long local_f0;
  undefined1 local_e8 [5];
  char cStack_e3;
  char cStack_e2;
  char cStack_e1;
  undefined8 uStack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined2 local_bc;
  allocator_type local_b9;
  undefined1 local_b8 [3];
  char cStack_b5;
  undefined1 auStack_b4 [12];
  undefined1 local_a8 [16];
  long local_90;
  data_type local_88;
  undefined8 local_68;
  uintwide_t<256U,_unsigned_short,_void,_true> local_50;
  
  uVar8 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  uVar9 = 0x12dd397;
  if (uVar8 != 0) {
    uVar9 = uVar8 % 0x7fffffab + (ulong)(uVar8 % 0x7fffffab == 0);
  }
  lVar10 = 0;
  puVar11 = &eng_sgn;
  do {
    uVar9 = (uVar9 * 0x9c4e) % 0x7fffffab;
    *(ulong *)((long)&eng_sgn + lVar10) = (ulong)((uint)uVar9 & 0xffffff);
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0xc0);
  _DAT_00212400 = (ulong)(DAT_002123f8 == 0);
  _DAT_00212408 = (undefined1  [16])0x0;
  uVar8 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>::seed
            ((subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL> *)eng_dig,uVar8);
  eng_dig._112_8_ = 0;
  bVar6 = 1;
  local_f0 = 0;
  do {
    iVar12 = 0x40;
    do {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_50,
                 (test_uintwide_t_edge *)0x1,false,0x4d,(int)puVar11);
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                ((string *)local_e8,(wide_integer *)&local_50,x);
      local_88._16_16_ = (undefined1  [16])0x0;
      local_88.m_double_first_limb = 0;
      local_68 = 1;
      boost::multiprecision::backends::
      cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
      ::do_assign_string((cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
                          *)&local_88,(char *)_local_e8,(false_ *)local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_e8 != &local_d8) {
        operator_delete(_local_e8,local_d8._M_allocated_capacity + 1);
      }
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )0x0;
      _local_e8 = (undefined1  [16])0x0;
      local_a8 = (undefined1  [16])0x0;
      _local_b8 = (undefined1  [16])0x0;
      bVar1 = test_import_bits::msv_options._M_elems[local_f0];
      math::wide_integer::export_bits<unsigned_short_*,_256U,_unsigned_short,_void,_false,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_50,
                 (unsigned_short *)local_e8,0x10,bVar1);
      boost::multiprecision::
      export_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_short*>
                ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_88,(unsigned_short *)local_b8,0x10,bVar1);
      auVar15[0] = -(local_d8._M_local_buf[0] == local_a8[0]);
      auVar15[1] = -(local_d8._M_local_buf[1] == local_a8[1]);
      auVar15[2] = -(local_d8._M_local_buf[2] == local_a8[2]);
      auVar15[3] = -(local_d8._M_local_buf[3] == local_a8[3]);
      auVar15[4] = -(local_d8._M_local_buf[4] == local_a8[4]);
      auVar15[5] = -(local_d8._M_local_buf[5] == local_a8[5]);
      auVar15[6] = -(local_d8._M_local_buf[6] == local_a8[6]);
      auVar15[7] = -(local_d8._M_local_buf[7] == local_a8[7]);
      auVar15[8] = -(local_d8._M_local_buf[8] == local_a8[8]);
      auVar15[9] = -(local_d8._M_local_buf[9] == local_a8[9]);
      auVar15[10] = -(local_d8._M_local_buf[10] == local_a8[10]);
      auVar15[0xb] = -(local_d8._M_local_buf[0xb] == local_a8[0xb]);
      auVar15[0xc] = -(local_d8._M_local_buf[0xc] == local_a8[0xc]);
      auVar15[0xd] = -(local_d8._M_local_buf[0xd] == local_a8[0xd]);
      auVar15[0xe] = -(local_d8._M_local_buf[0xe] == local_a8[0xe]);
      auVar15[0xf] = -(local_d8._M_local_buf[0xf] == local_a8[0xf]);
      auVar13[0] = -(local_e8[0] == local_b8[0]);
      auVar13[1] = -(local_e8[1] == local_b8[1]);
      auVar13[2] = -(local_e8[2] == local_b8[2]);
      auVar13[3] = -(local_e8[3] == cStack_b5);
      auVar13[4] = -(local_e8[4] == auStack_b4[0]);
      auVar13[5] = -(cStack_e3 == auStack_b4[1]);
      auVar13[6] = -(cStack_e2 == auStack_b4[2]);
      auVar13[7] = -(cStack_e1 == auStack_b4[3]);
      auVar13[8] = -((char)uStack_e0 == auStack_b4[4]);
      auVar13[9] = -(uStack_e0._1_1_ == auStack_b4[5]);
      auVar13[10] = -(uStack_e0._2_1_ == auStack_b4[6]);
      auVar13[0xb] = -(uStack_e0._3_1_ == auStack_b4[7]);
      auVar13[0xc] = -(uStack_e0._4_1_ == auStack_b4[8]);
      auVar13[0xd] = -(uStack_e0._5_1_ == auStack_b4[9]);
      auVar13[0xe] = -(uStack_e0._6_1_ == auStack_b4[10]);
      auVar13[0xf] = -(uStack_e0._7_1_ == auStack_b4[0xb]);
      auVar13 = auVar13 & auVar15;
      if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) {
        bVar6 = 0;
      }
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    local_f0 = local_f0 + 1;
  } while (local_f0 != 2);
  local_90 = 0;
  do {
    local_f0 = 0;
    do {
      iVar12 = 0x40;
      do {
        generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_50,
                   (test_uintwide_t_edge *)0x1,false,0x4d,(int)puVar11);
        math::wide_integer::to_string<256u,unsigned_short,void,false>
                  ((string *)local_e8,(wide_integer *)&local_50,x_00);
        local_88._16_16_ = (undefined1  [16])0x0;
        local_88.m_double_first_limb = 0;
        local_68 = 1;
        boost::multiprecision::backends::
        cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
        ::do_assign_string((cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
                            *)&local_88,(char *)_local_e8,(false_ *)local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_e8 != &local_d8) {
          operator_delete(_local_e8,local_d8._M_allocated_capacity + 1);
        }
        chunk_size = *(uint *)((long)test_import_bits::bits_for_chunks._M_elems + local_f0);
        __n = ((long)(int)(0x100 / (long)(int)chunk_size) + 1) -
              (ulong)((int)(0x100 % (long)(int)chunk_size) == 0);
        auVar2._14_2_ = 0;
        auVar2._0_14_ = stack0xffffffffffffff4a;
        _local_b8 = auVar2 << 0x10;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_e8,__n,
                   (value_type_conflict3 *)local_b8,(allocator_type *)&local_bc);
        local_bc = 0;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_b8,__n,
                   (value_type_conflict3 *)&local_bc,&local_b9);
        bVar1 = test_import_bits::msv_options._M_elems[local_90];
        math::wide_integer::
        export_bits<__gnu_cxx::__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>,_256U,_unsigned_short,_void,_false,_nullptr>
                  ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_50,_local_e8,chunk_size,
                   bVar1);
        boost::multiprecision::
        export_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                  ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_88,_local_b8,chunk_size,bVar1);
        pvVar5 = _local_b8;
        if (((long)uStack_e0 - (long)_local_e8 != 0) &&
           (iVar7 = bcmp(_local_e8,_local_b8,(long)uStack_e0 - (long)_local_e8), iVar7 != 0)) {
          bVar6 = 0;
        }
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,local_a8._0_8_ - (long)pvVar5);
        }
        if (_local_e8 != (unsigned_short *)0x0) {
          operator_delete(_local_e8,local_d8._M_allocated_capacity - (long)_local_e8);
        }
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      local_f0 = local_f0 + 4;
    } while (local_f0 != 0xc);
    local_90 = local_90 + 1;
  } while (local_90 != 2);
  local_f0 = 0;
  local_90 = 2;
  do {
    iVar12 = 0x40;
    do {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_50,
                 (test_uintwide_t_edge *)0x1,false,0x4d,(int)puVar11);
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                ((string *)local_e8,(wide_integer *)&local_50,x_01);
      local_88._16_16_ = (undefined1  [16])0x0;
      local_88.m_double_first_limb = 0;
      local_68 = 1;
      boost::multiprecision::backends::
      cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
      ::do_assign_string((cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
                          *)&local_88,(char *)_local_e8,(false_ *)local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_e8 != &local_d8) {
        operator_delete(_local_e8,local_d8._M_allocated_capacity + 1);
      }
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )0x0;
      _local_e8 = (undefined1  [16])0x0;
      local_a8 = (undefined1  [16])0x0;
      _local_b8 = (undefined1  [16])0x0;
      bVar1 = test_import_bits::msv_options._M_elems[local_f0];
      math::wide_integer::export_bits<unsigned_int_*,_256U,_unsigned_short,_void,_false,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_50,(uint *)local_e8,0x20,
                 bVar1);
      boost::multiprecision::
      export_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int*>
                ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_88,(uint *)local_b8,0x20,bVar1);
      auVar16[0] = -(local_d8._M_local_buf[0] == local_a8[0]);
      auVar16[1] = -(local_d8._M_local_buf[1] == local_a8[1]);
      auVar16[2] = -(local_d8._M_local_buf[2] == local_a8[2]);
      auVar16[3] = -(local_d8._M_local_buf[3] == local_a8[3]);
      auVar16[4] = -(local_d8._M_local_buf[4] == local_a8[4]);
      auVar16[5] = -(local_d8._M_local_buf[5] == local_a8[5]);
      auVar16[6] = -(local_d8._M_local_buf[6] == local_a8[6]);
      auVar16[7] = -(local_d8._M_local_buf[7] == local_a8[7]);
      auVar16[8] = -(local_d8._M_local_buf[8] == local_a8[8]);
      auVar16[9] = -(local_d8._M_local_buf[9] == local_a8[9]);
      auVar16[10] = -(local_d8._M_local_buf[10] == local_a8[10]);
      auVar16[0xb] = -(local_d8._M_local_buf[0xb] == local_a8[0xb]);
      auVar16[0xc] = -(local_d8._M_local_buf[0xc] == local_a8[0xc]);
      auVar16[0xd] = -(local_d8._M_local_buf[0xd] == local_a8[0xd]);
      auVar16[0xe] = -(local_d8._M_local_buf[0xe] == local_a8[0xe]);
      auVar16[0xf] = -(local_d8._M_local_buf[0xf] == local_a8[0xf]);
      auVar14[0] = -(local_e8[0] == local_b8[0]);
      auVar14[1] = -(local_e8[1] == local_b8[1]);
      auVar14[2] = -(local_e8[2] == local_b8[2]);
      auVar14[3] = -(local_e8[3] == cStack_b5);
      auVar14[4] = -(local_e8[4] == auStack_b4[0]);
      auVar14[5] = -(cStack_e3 == auStack_b4[1]);
      auVar14[6] = -(cStack_e2 == auStack_b4[2]);
      auVar14[7] = -(cStack_e1 == auStack_b4[3]);
      auVar14[8] = -((char)uStack_e0 == auStack_b4[4]);
      auVar14[9] = -(uStack_e0._1_1_ == auStack_b4[5]);
      auVar14[10] = -(uStack_e0._2_1_ == auStack_b4[6]);
      auVar14[0xb] = -(uStack_e0._3_1_ == auStack_b4[7]);
      auVar14[0xc] = -(uStack_e0._4_1_ == auStack_b4[8]);
      auVar14[0xd] = -(uStack_e0._5_1_ == auStack_b4[9]);
      auVar14[0xe] = -(uStack_e0._6_1_ == auStack_b4[10]);
      auVar14[0xf] = -(uStack_e0._7_1_ == auStack_b4[0xb]);
      auVar14 = auVar14 & auVar16;
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff) {
        bVar6 = 0;
      }
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    local_f0 = local_f0 + 1;
  } while (local_f0 != 2);
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t<int>
            (&local_50,-1,
             (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
  local_88._16_16_ = (undefined1  [16])0x0;
  local_88.m_double_first_limb = (double_limb_type)ZEXT816(1);
  local_68 = 1;
  auVar3._12_4_ = 0;
  auVar3._0_12_ = stack0xffffffffffffff1c;
  _local_e8 = auVar3 << 0x20;
  auVar4._12_4_ = 0;
  auVar4._0_12_ = auStack_b4;
  _local_b8 = auVar4 << 0x20;
  math::wide_integer::export_bits<unsigned_int_*,_256U,_unsigned_short,_void,_true,_nullptr>
            (&local_50,(uint *)local_e8,0x20,true);
  boost::multiprecision::
  export_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int*>
            ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_88,(uint *)local_b8,0x20,true);
  return (bool)((_local_b8 == 1 && local_e8._0_4_ == 1) & bVar6);
}

Assistant:

auto test_export_bits() -> bool // NOLINT(readability-function-cognitive-complexity)
{
  eng_sgn.seed(util::util_pseudorandom_time_point_seed::value<typename eng_sgn_type::result_type>());
  eng_dig.seed(util::util_pseudorandom_time_point_seed::value<typename eng_dig_type::result_type>());

  using local_boost_small_uint_backend_type =
    boost::multiprecision::cpp_int_backend<local_edge_cases::local_digits2_small,
                                           local_edge_cases::local_digits2_small,
                                           boost::multiprecision::unsigned_magnitude,
                                           boost::multiprecision::unchecked,
                                           void>;

  using local_boost_small_uint_type =
    boost::multiprecision::number<local_boost_small_uint_backend_type,
                                  boost::multiprecision::et_off>;

  auto result_is_ok = true;

  static const std::array<bool, static_cast<std::size_t>(UINT8_C(2))> msv_options = { true, false };

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify export_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having the same widths.
      // Use the full bit width and representation length of uintwide_t.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      using std::to_string;

            auto val_uintwide_t = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();
      const auto val_boost      = local_boost_small_uint_type(to_string(val_uintwide_t));

      using local_output_array_type =
        std::array<local_input_value_type, local_uintwide_t_small_unsigned_type::number_of_limbs>;

      using local_result_value_type = typename local_output_array_type::value_type;

      local_output_array_type bits_result_from_uintwide_t { };
      local_output_array_type bits_result_from_boost      { };

      static_cast<void>(export_bits(val_uintwide_t, bits_result_from_uintwide_t.begin(), static_cast<unsigned>(std::numeric_limits<local_result_value_type>::digits), msv_first));
      static_cast<void>(export_bits(val_boost,      bits_result_from_boost.begin(),      static_cast<unsigned>(std::numeric_limits<local_result_value_type>::digits), msv_first)); // NOLINT

      const auto result_export_bits_is_ok = std::equal(bits_result_from_uintwide_t.cbegin(),
                                                       bits_result_from_uintwide_t.cend(),
                                                       bits_result_from_boost.cbegin());

      result_is_ok = (result_export_bits_is_ok && result_is_ok);
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    static const std::array<unsigned, static_cast<std::size_t>(UINT8_C(3))> bits_for_chunks = { 7U, 9U, 15U };

    for(const auto& chunk_size : bits_for_chunks)
    {
      for(auto   i = static_cast<unsigned>(UINT8_C(0));
                 i < static_cast<unsigned>(loop_count_lo);
               ++i)
      {
        // Verify export_bits() and compare with Boost control value(s).
        // The input and output ranges have elements having the same widths.
        // Use various input bit counts less than the result limb's width.
        // Use the full size of elements in the wide integer for the
        // distance of the input range.

        using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

        using local_input_value_type = typename local_representation_type::value_type;

        using std::to_string;

              auto val_uintwide_t = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();
        const auto val_boost      = local_boost_small_uint_type(to_string(val_uintwide_t));

        using local_output_vector_type = std::vector<local_input_value_type>;

        using local_result_value_type = typename local_output_vector_type::value_type;

        const auto output_distance_chunk_size_has_mod =
        (
          static_cast<int>
          (
            std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits % static_cast<int>(chunk_size)
          ) != 0
        );

        const auto output_distance =
          static_cast<std::size_t>
          (
              static_cast<std::size_t>(std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / static_cast<int>(chunk_size))
            + static_cast<std::size_t>
              (
                output_distance_chunk_size_has_mod ? static_cast<std::size_t>(UINT8_C(1))
                                                   : static_cast<std::size_t>(UINT8_C(0))
              )
          );

        local_output_vector_type bits_result_from_uintwide_t(output_distance, static_cast<local_result_value_type>(UINT8_C(0)));
        local_output_vector_type bits_result_from_boost     (output_distance, static_cast<local_result_value_type>(UINT8_C(0)));

        static_cast<void>(export_bits(val_uintwide_t, bits_result_from_uintwide_t.begin(), chunk_size, msv_first));
        static_cast<void>(export_bits(val_boost,      bits_result_from_boost.begin(),      chunk_size, msv_first)); // NOLINT

        const auto result_export_bits_is_ok = std::equal(bits_result_from_uintwide_t.cbegin(),
                                                         bits_result_from_uintwide_t.cend(),
                                                         bits_result_from_boost.cbegin());

        result_is_ok = (result_export_bits_is_ok && result_is_ok);
      }
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify export_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having different widths.
      // Use various input bit counts exceeding the result limb's width.
      // Use the full size of elements in the wide integer for the
      // distance of the input range.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      using std::to_string;

            auto val_uintwide_t = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();
      const auto val_boost      = local_boost_small_uint_type(to_string(val_uintwide_t));

      #if defined(WIDE_INTEGER_NAMESPACE)
      using local_result_double_width_value_type =
        typename WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #else
      using local_result_double_width_value_type =
        typename ::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #endif

      using local_double_width_output_array_type =
        std::array<local_result_double_width_value_type, local_uintwide_t_small_unsigned_type::number_of_limbs / 2U>;

      local_double_width_output_array_type bits_result_double_width_from_uintwide_t { };
      local_double_width_output_array_type bits_result_double_width_from_boost      { };

      static_cast<void>(export_bits(val_uintwide_t, bits_result_double_width_from_uintwide_t.begin(), static_cast<unsigned>(std::numeric_limits<local_result_double_width_value_type>::digits), msv_first));
      static_cast<void>(export_bits(val_boost,      bits_result_double_width_from_boost.begin(),      static_cast<unsigned>(std::numeric_limits<local_result_double_width_value_type>::digits), msv_first)); // NOLINT

      const auto result_export_bits_is_ok = std::equal(bits_result_double_width_from_uintwide_t.cbegin(),
                                                       bits_result_double_width_from_uintwide_t.cend(),
                                                       bits_result_double_width_from_boost.cbegin());

      result_is_ok = (result_export_bits_is_ok && result_is_ok);
    }
  }

  {
    // Note that export_bits uses the absolute value.
    // So test this feature by using negative one here.
    const auto val_uintwide_t = local_uintwide_t_small_signed_type(-1);
    const auto val_boost      = local_boost_small_uint_type(1);

    using local_result_type = std::uint32_t;

    auto result_one_uintwide_t = local_result_type { };
    auto result_one_boost      = local_result_type { };

    static_cast<void>(export_bits(val_uintwide_t, &result_one_uintwide_t, static_cast<unsigned>(std::numeric_limits<local_result_type>::digits)));
    static_cast<void>(export_bits(val_boost,      &result_one_boost,      static_cast<unsigned>(std::numeric_limits<local_result_type>::digits)));

    const auto result_is_one_and_compare_one_is_ok = (   (result_one_uintwide_t == result_one_boost)
                                                      && (result_one_uintwide_t == 1));

    result_is_ok = (result_is_one_and_compare_one_is_ok && result_is_ok);
  }

  return result_is_ok;
}